

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marginal.cc
# Opt level: O3

void MARGINAL::predict_or_learn<true>(data *sm,single_learner *base,example *ec)

{
  float fVar1;
  byte bVar2;
  long lVar3;
  byte *pbVar4;
  features *pfVar5;
  undefined8 *puVar6;
  features *pfVar7;
  features *pfVar8;
  byte *pbVar9;
  byte bVar10;
  undefined8 local_88 [12];
  float local_28;
  
  bVar10 = 0;
  make_marginal<true>(sm,ec);
  if (sm->update_before_learn == true) {
    (**(code **)(base + 0x30))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
    fVar1 = (ec->pred).scalar;
    if (sm->compete == true) {
      sm->feature_pred = fVar1;
      compute_expert_loss<true>(sm,ec);
    }
    pbVar9 = (ec->super_example_predict).indices._begin;
    pbVar4 = (ec->super_example_predict).indices._end;
    if (pbVar9 != pbVar4) {
      do {
        bVar2 = *pbVar9;
        if (sm->id_features[bVar2] == true) {
          pfVar8 = (ec->super_example_predict).feature_space + bVar2;
          pfVar5 = sm->temp + bVar2;
          puVar6 = local_88;
          for (lVar3 = 0xd; lVar3 != 0; lVar3 = lVar3 + -1) {
            *puVar6 = (pfVar5->values)._begin;
            pfVar5 = (features *)((long)pfVar5 + (ulong)bVar10 * -0x10 + 8);
            puVar6 = puVar6 + (ulong)bVar10 * -2 + 1;
          }
          pfVar5 = pfVar8;
          pfVar7 = sm->temp + bVar2;
          for (lVar3 = 0xc; lVar3 != 0; lVar3 = lVar3 + -1) {
            (pfVar7->values)._begin = (pfVar5->values)._begin;
            pfVar5 = (features *)((long)pfVar5 + ((ulong)bVar10 * -2 + 1) * 8);
            pfVar7 = (features *)((long)pfVar7 + (ulong)bVar10 * -0x10 + 8);
          }
          sm->temp[bVar2].sum_feat_sq = (ec->super_example_predict).feature_space[bVar2].sum_feat_sq
          ;
          puVar6 = local_88;
          for (lVar3 = 0xc; lVar3 != 0; lVar3 = lVar3 + -1) {
            (pfVar8->values)._begin = (float *)*puVar6;
            puVar6 = puVar6 + (ulong)bVar10 * -2 + 1;
            pfVar8 = (features *)((long)pfVar8 + ((ulong)bVar10 * -2 + 1) * 8);
          }
          (ec->super_example_predict).feature_space[bVar2].sum_feat_sq = local_28;
          pbVar4 = (ec->super_example_predict).indices._end;
        }
        pbVar9 = pbVar9 + 1;
      } while (pbVar9 != pbVar4);
    }
    update_marginal(sm,ec);
    make_marginal<true>(sm,ec);
    (**(code **)(base + 0x28))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
    (ec->pred).scalar = fVar1;
  }
  else {
    (**(code **)(base + 0x28))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
    if (sm->compete == true) {
      sm->feature_pred = (ec->pred).scalar;
      compute_expert_loss<true>(sm,ec);
    }
    update_marginal(sm,ec);
  }
  pbVar9 = (ec->super_example_predict).indices._begin;
  pbVar4 = (ec->super_example_predict).indices._end;
  if (pbVar9 != pbVar4) {
    do {
      bVar2 = *pbVar9;
      if (sm->id_features[bVar2] == true) {
        pfVar8 = (ec->super_example_predict).feature_space + bVar2;
        pfVar5 = sm->temp + bVar2;
        puVar6 = local_88;
        for (lVar3 = 0xd; lVar3 != 0; lVar3 = lVar3 + -1) {
          *puVar6 = (pfVar5->values)._begin;
          pfVar5 = (features *)((long)pfVar5 + (ulong)bVar10 * -0x10 + 8);
          puVar6 = puVar6 + (ulong)bVar10 * -2 + 1;
        }
        pfVar5 = pfVar8;
        pfVar7 = sm->temp + bVar2;
        for (lVar3 = 0xc; lVar3 != 0; lVar3 = lVar3 + -1) {
          (pfVar7->values)._begin = (pfVar5->values)._begin;
          pfVar5 = (features *)((long)pfVar5 + ((ulong)bVar10 * -2 + 1) * 8);
          pfVar7 = (features *)((long)pfVar7 + (ulong)bVar10 * -0x10 + 8);
        }
        sm->temp[bVar2].sum_feat_sq = (ec->super_example_predict).feature_space[bVar2].sum_feat_sq;
        puVar6 = local_88;
        for (lVar3 = 0xc; lVar3 != 0; lVar3 = lVar3 + -1) {
          (pfVar8->values)._begin = (float *)*puVar6;
          puVar6 = puVar6 + (ulong)bVar10 * -2 + 1;
          pfVar8 = (features *)((long)pfVar8 + ((ulong)bVar10 * -2 + 1) * 8);
        }
        (ec->super_example_predict).feature_space[bVar2].sum_feat_sq = local_28;
        pbVar4 = (ec->super_example_predict).indices._end;
      }
      pbVar9 = pbVar9 + 1;
    } while (pbVar9 != pbVar4);
  }
  return;
}

Assistant:

void predict_or_learn(data& sm, LEARNER::single_learner& base, example& ec)
{
  make_marginal<is_learn>(sm, ec);
  if (is_learn)
    if (sm.update_before_learn)
    {
      base.predict(ec);
      float pred = ec.pred.scalar;
      if (sm.compete)
      {
        sm.feature_pred = pred;
        compute_expert_loss<is_learn>(sm, ec);
      }
      undo_marginal(sm, ec);
      update_marginal(sm, ec);  // update features before learning.
      make_marginal<is_learn>(sm, ec);
      base.learn(ec);
      ec.pred.scalar = pred;
    }
    else
    {
      base.learn(ec);
      if (sm.compete)
      {
        sm.feature_pred = ec.pred.scalar;
        compute_expert_loss<is_learn>(sm, ec);
      }
      update_marginal(sm, ec);
    }
  else
  {
    base.predict(ec);
    float pred = ec.pred.scalar;
    if (sm.compete)
    {
      sm.feature_pred = pred;
      compute_expert_loss<is_learn>(sm, ec);
    }
  }

  // undo marginalization
  undo_marginal(sm, ec);
}